

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_record_message(mg_session *session,mg_message_record **message)

{
  undefined8 *puVar1;
  mg_session *in_RSI;
  mg_session *in_RDI;
  mg_message_record *tmessage;
  int status;
  mg_list *fields;
  size_t in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  mg_list **in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mg_session_read_list(in_RSI,in_stack_ffffffffffffffe0);
  if (local_4 == 0) {
    puVar1 = (undefined8 *)mg_allocator_malloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (puVar1 == (undefined8 *)0x0) {
      mg_session_set_error(in_RDI,"out of memory");
      mg_list_destroy((mg_list *)0x10a654);
      local_4 = -3;
    }
    else {
      *puVar1 = in_stack_ffffffffffffffe0;
      *(undefined8 **)in_RSI = puVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_record_message(mg_session *session,
                                   mg_message_record **message) {
  mg_list *fields;
  MG_RETURN_IF_FAILED(mg_session_read_list(session, &fields));

  mg_message_record *tmessage = mg_allocator_malloc(session->decoder_allocator,
                                                    sizeof(mg_message_record));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    mg_list_destroy(fields);
    return MG_ERROR_OOM;
  }
  tmessage->fields = fields;
  *message = tmessage;
  return 0;
}